

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::GetSpanVector(ON_PolyCurve *this,double *s)

{
  uint uVar1;
  ON_Curve *pOVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  ON_Interval segloc;
  ON_Interval sp;
  ON_Interval local_50;
  ON_Interval local_40;
  
  ON_Interval::ON_Interval(&local_40);
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar8 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; (uVar8 != uVar6 &&
         (pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar8],
         pOVar2 != (ON_Curve *)0x0)); uVar8 = uVar8 + 1) {
    iVar4 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])();
    if (iVar4 == 0) break;
    pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar8];
    iVar5 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2a])(pOVar2,s);
    if ((char)iVar5 == '\0') break;
    pdVar3 = (this->m_t).m_a;
    ON_Interval::Set(&local_40,pdVar3[uVar8],pdVar3[uVar8 + 1]);
    pdVar3 = s + iVar4;
    ON_Interval::ON_Interval(&local_50,*s,*pdVar3);
    dVar9 = ON_Interval::Min(&local_40);
    if ((dVar9 != *s) || (NAN(dVar9) || NAN(*s))) {
LAB_00592531:
      for (lVar7 = 0; lVar7 <= iVar4; lVar7 = lVar7 + 1) {
        dVar9 = ON_Interval::NormalizedParameterAt(&local_50,s[lVar7]);
        dVar9 = ON_Interval::ParameterAt(&local_40,dVar9);
        s[lVar7] = dVar9;
      }
    }
    else {
      dVar9 = ON_Interval::Max(&local_40);
      if ((dVar9 != *pdVar3) || (NAN(dVar9) || NAN(*pdVar3))) goto LAB_00592531;
    }
    s = pdVar3;
  }
  return (long)(int)uVar1 <= (long)uVar8;
}

Assistant:

bool ON_PolyCurve::GetSpanVector( // span "knots" 
       double* s // array of length SpanCount() + 1 
       ) const
{
  ON_Interval sp;
  double t;
  const int segment_count = Count();
  int i, j, k;
  for ( i = 0; i < segment_count; i++  ) {
    if ( !m_segment[i] )
      return false;
    j = m_segment[i]->SpanCount();
    if ( j == 0 )
      return 0;
    if ( !m_segment[i]->GetSpanVector( s ) )
      return false;
    sp.Set( m_t[i], m_t[i+1] );
		ON_Interval segloc(s[0],s[j]);
    if ( sp.Min() != s[0] || sp.Max() != s[j] ) {
      for ( k = 0; k <= j; k++ ) {
        t = segloc.NormalizedParameterAt(s[k]);
        s[k] = sp.ParameterAt(t);
      }
    }

    s += j;
  }
  return true;
}